

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service.hpp
# Opt level: O2

error_code __thiscall
asio::detail::reactive_socket_service<asio::ip::tcp>::
accept<asio::basic_socket<asio::ip::tcp,asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context&>,asio::execution::detail::blocking::never_t<0>,asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>>>>>
          (reactive_socket_service<asio::ip::tcp> *this,implementation_type *impl,
          basic_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
          *peer,endpoint_type *peer_endpoint,error_code *ec)

{
  size_t *addrlen;
  error_category *peVar1;
  uint uVar2;
  error_code eVar3;
  socket_holder new_socket;
  size_t addr_len;
  socket_type local_2c;
  
  if ((peer->impl_).implementation_.super_base_implementation_type.socket_ == -1) {
    addr_len = 0x1c;
    if (peer_endpoint == (endpoint_type *)0x0) {
      addr_len = 0;
    }
    addrlen = &addr_len;
    if (peer_endpoint == (endpoint_type *)0x0) {
      addrlen = (size_t *)0x0;
    }
    new_socket.socket_ =
         socket_ops::sync_accept
                   ((impl->super_base_implementation_type).socket_,
                    (impl->super_base_implementation_type).state_,(socket_addr_type *)peer_endpoint,
                    addrlen,ec);
    if (new_socket.socket_ == -1) {
      uVar2 = ec->_M_value;
    }
    else {
      if (peer_endpoint != (endpoint_type *)0x0) {
        ip::detail::endpoint::resize(&peer_endpoint->impl_,addr_len);
      }
      local_2c = new_socket.socket_;
      basic_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
      ::assign(peer,&impl->protocol_,&local_2c,ec);
      uVar2 = ec->_M_value;
      if (uVar2 == 0) {
        new_socket.socket_ = -1;
        uVar2 = 0;
      }
    }
    peVar1 = ec->_M_cat;
    socket_holder::~socket_holder(&new_socket);
  }
  else {
    std::error_code::operator=(ec,already_open);
    uVar2 = ec->_M_value;
    peVar1 = ec->_M_cat;
  }
  eVar3._4_4_ = 0;
  eVar3._M_value = uVar2;
  eVar3._M_cat = peVar1;
  return eVar3;
}

Assistant:

asio::error_code accept(implementation_type& impl,
      Socket& peer, endpoint_type* peer_endpoint, asio::error_code& ec)
  {
    // We cannot accept a socket that is already open.
    if (peer.is_open())
    {
      ec = asio::error::already_open;
      return ec;
    }

    std::size_t addr_len = peer_endpoint ? peer_endpoint->capacity() : 0;
    socket_holder new_socket(socket_ops::sync_accept(impl.socket_,
          impl.state_, peer_endpoint ? peer_endpoint->data() : 0,
          peer_endpoint ? &addr_len : 0, ec));

    // On success, assign new connection to peer socket object.
    if (new_socket.get() != invalid_socket)
    {
      if (peer_endpoint)
        peer_endpoint->resize(addr_len);
      peer.assign(impl.protocol_, new_socket.get(), ec);
      if (!ec)
        new_socket.release();
    }

    return ec;
  }